

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<int,float>(Thread *this,UnopFunc<int,_float> *f)

{
  int iVar1;
  long lVar2;
  SR result;
  Simd<float,_(unsigned_char)__x04_> val;
  Value local_38;
  Value local_28;
  
  local_28 = Pop(this);
  lVar2 = 0;
  do {
    iVar1 = (*f)(*(float *)((long)&local_28 + lVar2));
    *(int *)((long)&local_38 + lVar2) = iVar1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  Push(this,local_38);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}